

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginOperator.cpp
# Opt level: O1

void __thiscall
adios2::plugin::PluginOperator::PluginOperator(PluginOperator *this,Params *parameters)

{
  Params *this_00;
  _Rb_tree_header *p_Var1;
  unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
  *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Impl *pIVar4;
  iterator iVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  pointer *__ptr;
  string local_70;
  string local_50;
  
  paVar3 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"plugin","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"plugin","");
  core::Operator::Operator(&this->super_Operator,&local_70,PLUGIN_INTERFACE,&local_50,parameters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  (this->super_Operator)._vptr_Operator = (_func_int **)&PTR__PluginOperator_00883800;
  pIVar4 = (Impl *)operator_new(0x80);
  puVar2 = &this->m_Impl;
  p_Var8 = (_Base_ptr)((long)&(pIVar4->m_PluginParams)._M_t + 8);
  (((_Rb_tree_header *)((long)&(pIVar4->m_PluginParams)._M_t + 8))->_M_header)._M_color = _S_red;
  *(_Base_ptr *)((long)&(pIVar4->m_PluginParams)._M_t + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(pIVar4->m_PluginParams)._M_t + 0x18) = p_Var8;
  *(_Base_ptr *)((long)&(pIVar4->m_PluginParams)._M_t + 0x20) = p_Var8;
  *(size_t *)((long)&(pIVar4->m_PluginParams)._M_t + 0x28) = 0;
  *(undefined8 *)&(pIVar4->m_HandleCreate).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pIVar4->m_HandleCreate).super__Function_base + 8) = 0;
  *(_Manager_type *)((long)&(pIVar4->m_HandleCreate).super__Function_base + 0x10) =
       (_Manager_type)0x0;
  (pIVar4->m_HandleCreate)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(pIVar4->m_HandleDestroy).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pIVar4->m_HandleDestroy).super__Function_base + 8) = 0;
  *(_Manager_type *)((long)&(pIVar4->m_HandleDestroy).super__Function_base + 0x10) =
       (_Manager_type)0x0;
  (pIVar4->m_HandleDestroy)._M_invoker = (_Invoker_type)0x0;
  pIVar4->m_Plugin = (PluginOperatorInterface *)0x0;
  pIVar4->m_Verbosity = 0;
  (this->m_Impl)._M_t.
  super___uniq_ptr_impl<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::plugin::PluginOperator::Impl_*,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
  .super__Head_base<0UL,_adios2::plugin::PluginOperator::Impl_*,_false>._M_head_impl = pIVar4;
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"verbose","");
  this_00 = &(this->super_Operator).m_Parameters;
  helper::GetParameter<int>
            (this_00,&local_70,
             &((puVar2->_M_t).
               super___uniq_ptr_impl<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_adios2::plugin::PluginOperator::Impl_*,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
               .super__Head_base<0UL,_adios2::plugin::PluginOperator::Impl_*,_false>._M_head_impl)->
              m_Verbosity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"pluginname","");
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"pluginlibrary","");
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  p_Var1 = &(this->super_Operator).m_Parameters._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar6._M_node != p_Var1 && (_Rb_tree_header *)iVar5._M_node != p_Var1) {
    pIVar4 = (puVar2->_M_t).
             super___uniq_ptr_impl<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_adios2::plugin::PluginOperator::Impl_*,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
             .super__Head_base<0UL,_adios2::plugin::PluginOperator::Impl_*,_false>._M_head_impl;
    local_70._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"PluginName","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&pIVar4->m_PluginParams,&local_70);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar3) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    pIVar4 = (puVar2->_M_t).
             super___uniq_ptr_impl<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_adios2::plugin::PluginOperator::Impl_*,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
             .super__Head_base<0UL,_adios2::plugin::PluginOperator::Impl_*,_false>._M_head_impl;
    local_70._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"PluginLibrary","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&pIVar4->m_PluginParams,&local_70);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar3) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    PluginInit(this,(string *)(iVar5._M_node + 2),(string *)(iVar6._M_node + 2));
  }
  return;
}

Assistant:

PluginOperator::PluginOperator(const Params &parameters)
: Operator("plugin", PLUGIN_INTERFACE, "plugin", parameters), m_Impl(new Impl)
{
    helper::GetParameter(m_Parameters, "verbose", m_Impl->m_Verbosity);

    // It is possible for 'pluginname' and 'pluginlibrary' to not be in
    // m_Parameters (e.g., when using bpls, which will call InverseOperate).
    // PluginName and PluginLibrary which will be saved in header info in the
    // Operate() call, so that in this situation, the plugin can be loaded
    // to perform InverseOperate.
    auto pluginNameIt = m_Parameters.find("pluginname");
    auto pluginLibIt = m_Parameters.find("pluginlibrary");
    if (pluginNameIt != m_Parameters.end() && pluginLibIt != m_Parameters.end())
    {
        m_Impl->m_PluginParams["PluginName"] = pluginNameIt->second;
        m_Impl->m_PluginParams["PluginLibrary"] = pluginLibIt->second;
        PluginInit(pluginNameIt->second, pluginLibIt->second);
    }
}